

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O2

void adios2::core::engine::BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator
               (MPIShmChain *a,BufferV *Data)

{
  ShmDataBuffer *pSVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  _Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_48;
  
  (*Data->_vptr_BufferV[2])(&local_48);
  uVar6 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48._M_impl.super__Vector_impl_data._M_start >> 4;
  uVar4 = 0;
  uVar3 = 0;
  while (uVar3 < uVar6) {
    pSVar1 = aggregator::MPIShmChain::LockProducerBuffer(a);
    pSVar1->actual_size = 0;
    uVar7 = pSVar1->max_size;
    uVar5 = 0;
    do {
      uVar2 = local_48._M_impl.super__Vector_impl_data._M_start[uVar3].iov_len - uVar4;
      uVar8 = uVar7 - uVar5;
      if (uVar2 < uVar7 - uVar5) {
        uVar8 = uVar2;
      }
      memcpy(pSVar1->buf + uVar5,
             (void *)((long)local_48._M_impl.super__Vector_impl_data._M_start[uVar3].iov_base +
                     uVar4),uVar8);
      uVar5 = pSVar1->actual_size + uVar8;
      pSVar1->actual_size = uVar5;
      uVar8 = uVar8 + uVar4;
      bVar9 = uVar8 < local_48._M_impl.super__Vector_impl_data._M_start[uVar3].iov_len;
      uVar4 = 0;
      if (bVar9) {
        uVar4 = uVar8;
      }
      uVar3 = (uVar3 + 1) - (ulong)bVar9;
      uVar7 = pSVar1->max_size;
    } while ((uVar5 < uVar7) && (uVar3 < uVar6));
    aggregator::MPIShmChain::UnlockProducerBuffer(a);
  }
  std::_Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator(aggregator::MPIShmChain *a,
                                                                  format::BufferV *Data)
{
    /* In a loop, copy the local data into the shared memory, alternating
       between the two segments.
    */

    std::vector<core::iovec> DataVec = Data->DataVec();
    size_t nBlocks = DataVec.size();

    // size_t sent = 0;
    size_t block = 0;
    size_t temp_offset = 0;
    while (block < nBlocks)
    {
        // potentially blocking call waiting on Aggregator
        aggregator::MPIShmChain::ShmDataBuffer *b = a->LockProducerBuffer();
        // b->max_size: how much we can copy
        // b->actual_size: how much we actually copy
        b->actual_size = 0;
        while (true)
        {
            /* Copy n bytes from the current block, current offset to shm
                making sure to use up to shm_size bytes
            */
            size_t n = DataVec[block].iov_len - temp_offset;
            if (n > (b->max_size - b->actual_size))
            {
                n = b->max_size - b->actual_size;
            }
            std::memcpy(&b->buf[b->actual_size],
                        (const char *)DataVec[block].iov_base + temp_offset, n);
            b->actual_size += n;

            /* Have we processed the entire block or staying with it? */
            if (n + temp_offset < DataVec[block].iov_len)
            {
                temp_offset += n;
            }
            else
            {
                temp_offset = 0;
                ++block;
            }

            /* Have we reached the max allowed shm size ?*/
            if (b->actual_size >= b->max_size)
            {
                break;
            }
            if (block >= nBlocks)
            {
                break;
            }
        }
        // sent += b->actual_size;
        a->UnlockProducerBuffer();
    }
}